

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  long lVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  UnitTestImpl *pUVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  TestInfo **ppTVar9;
  OsStackTraceGetterInterface *pOVar10;
  pointer ppTVar11;
  long lVar12;
  uint uVar13;
  pair<testing::TestInfo_**,_long> pVar14;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  pUVar5 = UnitTest::GetInstance::instance.impl_;
  (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
  UnitTest::GetInstance();
  pTVar2 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  ppTVar11 = (this->test_info_list_).
             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar3 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar11 != ppTVar3) {
    lVar8 = (long)ppTVar3 - (long)ppTVar11 >> 3;
    pVar14 = std::get_temporary_buffer<testing::TestInfo*>((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
    lVar8 = pVar14.second;
    ppTVar9 = pVar14.first;
    if (ppTVar9 == (TestInfo **)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar11,ppTVar3);
      lVar8 = 0;
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestInfo**,long,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar11,ppTVar3,ppTVar9,lVar8);
    }
    operator_delete(ppTVar9,lVar8 << 3);
  }
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[6])(pTVar2,this);
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[7])(pTVar2,this);
  if (pUVar5->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar10 = (OsStackTraceGetterInterface *)operator_new(8);
    pOVar10->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0014f4c0;
    pUVar5->os_stack_trace_getter_ = pOVar10;
  }
  (*pUVar5->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x130280,(char *)0x0);
  bVar6 = TestResult::Failed(&this->ad_hoc_test_result_);
  bVar7 = true;
  if (!bVar6) {
    bVar7 = TestResult::Skipped(&this->ad_hoc_test_result_);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar8 / 1000000;
  lVar8 = std::chrono::_V2::steady_clock::now();
  ppTVar11 = (this->test_info_list_).
             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11) >> 3)) {
    lVar12 = 1;
    do {
      lVar1 = lVar12 + -1;
      if (bVar7 == false) {
        piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0xffffffff;
        if (lVar1 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
          uVar13 = piVar4[lVar12 + -1];
        }
        TestInfo::Run(ppTVar11[uVar13]);
      }
      else {
        piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0xffffffff;
        if (lVar1 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
          uVar13 = piVar4[lVar12 + -1];
        }
        TestInfo::Skip(ppTVar11[uVar13]);
      }
      if (FLAGS_gtest_fail_fast == '\x01') {
        piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0xffffffff;
        if (lVar1 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
          uVar13 = piVar4[lVar12 + -1];
        }
        bVar6 = TestResult::Failed(&(this->test_info_list_).
                                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar13]->result_);
        if (bVar6) goto LAB_0011d601;
      }
      ppTVar11 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar6 = lVar12 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar11) >> 3);
      lVar12 = lVar12 + 1;
    } while (bVar6);
  }
LAB_0011d615:
  lVar12 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar12 - lVar8) / 1000000;
  if (pUVar5->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar10 = (OsStackTraceGetterInterface *)operator_new(8);
    pOVar10->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0014f4c0;
    pUVar5->os_stack_trace_getter_ = pOVar10;
  }
  (*pUVar5->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x13028c,(char *)0x0);
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2,this);
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar2,this);
  pUVar5->current_test_suite_ = (TestSuite *)0x0;
  return;
LAB_0011d601:
  for (; ppTVar11 = (this->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
      (int)lVar12 <
      (int)((ulong)((long)(this->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11) >> 3);
      lVar12 = lVar12 + 1) {
    piVar4 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0xffffffff;
    if (lVar12 < (int)((ulong)((long)(this->test_indices_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
      uVar13 = piVar4[lVar12];
    }
    TestInfo::Skip(ppTVar11[uVar13]);
  }
  goto LAB_0011d615;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}